

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

unique_ptr<Descriptor,_std::default_delete<Descriptor>_> __thiscall
wallet::GetDescriptor
          (wallet *this,CWallet *wallet,CCoinControl *coin_control,CScript *script_pubkey)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  FlatSigningProvider *this_00;
  pointer __p;
  long in_FS_OFFSET;
  MultiSigningProvider providers;
  FlatSigningProvider *local_98;
  long *local_90;
  MultiSigningProvider local_88;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__MultiSigningProvider_006cce48;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CWallet::GetScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_68,wallet,script_pubkey);
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var2 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      (**(code **)(**(long **)(p_Var2 + 1) + 0xa8))(&local_90,*(long **)(p_Var2 + 1),script_pubkey);
      MultiSigningProvider::AddProvider
                (&local_88,
                 (unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>)&local_90);
      if (local_90 != (long *)0x0) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&local_68);
  if (coin_control != (CCoinControl *)0x0) {
    this_00 = (FlatSigningProvider *)operator_new(0xf8);
    FlatSigningProvider::FlatSigningProvider(this_00,&coin_control->m_external_provider);
    local_68._M_impl._0_8_ = (FlatSigningProvider *)0x0;
    local_98 = this_00;
    MultiSigningProvider::AddProvider
              (&local_88,
               (unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>)&local_98);
    if (local_98 != (FlatSigningProvider *)0x0) {
      (*(local_98->super_SigningProvider)._vptr_SigningProvider[1])();
    }
    local_98 = (FlatSigningProvider *)0x0;
    if ((FlatSigningProvider *)local_68._M_impl._0_8_ != (FlatSigningProvider *)0x0) {
      std::default_delete<FlatSigningProvider>::operator()
                ((default_delete<FlatSigningProvider> *)&local_68,
                 (FlatSigningProvider *)local_68._M_impl._0_8_);
    }
  }
  InferDescriptor((CScript *)this,(SigningProvider *)script_pubkey);
  local_88.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__MultiSigningProvider_006cce48;
  std::
  vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ::~vector(&local_88.m_providers);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<Descriptor,_std::default_delete<Descriptor>,_true,_true>)
           (__uniq_ptr_data<Descriptor,_std::default_delete<Descriptor>,_true,_true>)this;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<Descriptor> GetDescriptor(const CWallet* wallet, const CCoinControl* coin_control,
                                                 const CScript script_pubkey)
{
    MultiSigningProvider providers;
    for (const auto spkman: wallet->GetScriptPubKeyMans(script_pubkey)) {
        providers.AddProvider(spkman->GetSolvingProvider(script_pubkey));
    }
    if (coin_control) {
        providers.AddProvider(std::make_unique<FlatSigningProvider>(coin_control->m_external_provider));
    }
    return InferDescriptor(script_pubkey, providers);
}